

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.h
# Opt level: O0

String * __thiscall
kj::str<char_const(&)[4],unsigned_int&,char>
          (String *__return_storage_ptr__,kj *this,char (*params) [4],uint *params_1,char *params_2)

{
  char (*value) [4];
  kj *this_00;
  char *value_00;
  uint *value_01;
  char local_51 [1];
  CappedArray<char,_14UL> local_50;
  ArrayPtr<const_char> local_38;
  uint *local_28;
  char *params_local_2;
  uint *params_local_1;
  char (*params_local) [4];
  
  local_28 = params_1;
  params_local_2 = *params;
  params_local_1 = (uint *)this;
  params_local = (char (*) [4])__return_storage_ptr__;
  value = ::const((char (*) [4])this);
  local_38 = toCharSequence<char_const(&)[4]>(value);
  this_00 = (kj *)fwd<unsigned_int&>((uint *)params_local_2);
  toCharSequence<unsigned_int&>(&local_50,this_00,value_01);
  value_00 = fwd<char>((NoInfer<char> *)local_28);
  local_51[0] = (char)toCharSequence<char>(value_00);
  _::concat<kj::ArrayPtr<char_const>,kj::CappedArray<char,14ul>,kj::FixedArray<char,1ul>>
            (__return_storage_ptr__,(_ *)&local_38,(ArrayPtr<const_char> *)&local_50,
             (CappedArray<char,_14UL> *)local_51,(FixedArray<char,_1UL> *)params_2);
  return __return_storage_ptr__;
}

Assistant:

String str(Params&&... params) {
  // Magic function which builds a string from a bunch of arbitrary values.  Example:
  //     str(1, " / ", 2, " = ", 0.5)
  // returns:
  //     "1 / 2 = 0.5"
  // To teach `str` how to stringify a type, see `Stringifier`.

  return _::concat(toCharSequence(kj::fwd<Params>(params))...);
}